

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dwarf.cc
# Opt level: O0

void bloaty::ReadDWARFPubNames(InfoReader *reader,string_view section,RangeSink *sink)

{
  string_view file_range;
  string_view name;
  size_type sVar1;
  CU *this;
  ulong uVar2;
  string *this_00;
  string_view *in_RCX;
  char *in_RDX;
  size_t in_RSI;
  undefined1 auVar3 [16];
  CU cu;
  CUIter iter;
  uint64_t debug_info_offset;
  string_view unit;
  string_view full_unit;
  CompilationUnitSizes sizes;
  string_view remaining;
  string_view *in_stack_fffffffffffffe38;
  string_view *in_stack_fffffffffffffe50;
  CompilationUnitSizes *this_01;
  basic_string_view<char,_std::char_traits<char>_> *this_02;
  CU *in_stack_fffffffffffffe78;
  Section section_00;
  undefined7 in_stack_fffffffffffffe80;
  undefined1 in_stack_fffffffffffffe87;
  size_t in_stack_fffffffffffffe98;
  CU *in_stack_fffffffffffffea8;
  InfoReader *in_stack_fffffffffffffeb0;
  CUIter *in_stack_fffffffffffffeb8;
  CU local_140;
  undefined1 local_88 [24];
  uint64_t local_70;
  basic_string_view<char,_std::char_traits<char>_> local_68;
  string_view local_58;
  basic_string_view<char,_std::char_traits<char>_> local_48;
  CompilationUnitSizes local_34;
  basic_string_view<char,_std::char_traits<char>_> local_30;
  string_view *local_20;
  
  local_30._M_len = in_RSI;
  local_30._M_str = in_RDX;
  local_20 = in_RCX;
  while( true ) {
    section_00 = (Section)((ulong)in_stack_fffffffffffffe78 >> 0x20);
    sVar1 = std::basic_string_view<char,_std::char_traits<char>_>::size(&local_30);
    if (sVar1 == 0) break;
    local_48._M_len = local_30._M_len;
    local_48._M_str = local_30._M_str;
    this_01 = &local_34;
    local_58 = dwarf::CompilationUnitSizes::ReadInitialLength(this_01,in_stack_fffffffffffffe50);
    this_02 = &local_58;
    this = (CU *)std::basic_string_view<char,_std::char_traits<char>_>::size(this_02);
    in_stack_fffffffffffffe50 =
         (string_view *)std::basic_string_view<char,_std::char_traits<char>_>::data(this_02);
    std::basic_string_view<char,_std::char_traits<char>_>::data(&local_48);
    local_68 = std::basic_string_view<char,_std::char_traits<char>_>::substr
                         (this_02,(size_type)this_01,(size_type)in_stack_fffffffffffffe50);
    local_48._M_len = local_68._M_len;
    local_48._M_str = local_68._M_str;
    dwarf::CompilationUnitSizes::ReadDWARFVersion
              ((CompilationUnitSizes *)this,in_stack_fffffffffffffe38);
    local_70 = dwarf::CompilationUnitSizes::ReadDWARFOffset
                         ((CompilationUnitSizes *)this,in_stack_fffffffffffffe38);
    dwarf::InfoReader::GetCUIter
              ((InfoReader *)CONCAT17(in_stack_fffffffffffffe87,in_stack_fffffffffffffe80),
               section_00,(uint64_t)local_88);
    in_stack_fffffffffffffe78 = &local_140;
    dwarf::CU::CU(this);
    in_stack_fffffffffffffe87 =
         dwarf::CUIter::NextCU
                   (in_stack_fffffffffffffeb8,in_stack_fffffffffffffeb0,in_stack_fffffffffffffea8);
    if ((bool)in_stack_fffffffffffffe87) {
      dwarf::CU::unit_name_abi_cxx11_(&local_140);
      uVar2 = std::__cxx11::string::empty();
      if ((uVar2 & 1) == 0) {
        in_stack_fffffffffffffe38 = local_20;
        this_00 = dwarf::CU::unit_name_abi_cxx11_(&local_140);
        auVar3 = std::__cxx11::string::operator_cast_to_basic_string_view((string *)this_00);
        in_stack_fffffffffffffea8 = auVar3._8_8_;
        name._M_str = auVar3._0_8_;
        name._M_len = in_stack_fffffffffffffe98;
        file_range._M_str = local_48._M_str;
        file_range._M_len = local_48._M_len;
        RangeSink::AddFileRange
                  ((RangeSink *)CONCAT17(in_stack_fffffffffffffe87,in_stack_fffffffffffffe80),
                   (char *)in_stack_fffffffffffffe78,name,file_range);
      }
    }
    dwarf::CU::~CU(this);
  }
  return;
}

Assistant:

static void ReadDWARFPubNames(dwarf::InfoReader& reader, string_view section,
                              RangeSink* sink) {
  string_view remaining = section;

  while (remaining.size() > 0) {
    dwarf::CompilationUnitSizes sizes;
    string_view full_unit = remaining;
    string_view unit = sizes.ReadInitialLength(&remaining);
    full_unit =
        full_unit.substr(0, unit.size() + (unit.data() - full_unit.data()));
    sizes.ReadDWARFVersion(&unit);
    uint64_t debug_info_offset = sizes.ReadDWARFOffset(&unit);

    dwarf::CUIter iter = reader.GetCUIter(
        dwarf::InfoReader::Section::kDebugInfo, debug_info_offset);
    dwarf::CU cu;
    if (iter.NextCU(reader, &cu) && !cu.unit_name().empty()) {
      sink->AddFileRange("dwarf_pubnames", cu.unit_name(), full_unit);
    }
  }
}